

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O2

void __thiscall RVO::Agent::insertAgentNeighbor(Agent *this,Agent *agent,float *rangeSq)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  pointer ppVar4;
  ulong uVar5;
  Agent **ppAVar6;
  float fVar7;
  undefined1 local_28 [8];
  Agent *local_20;
  
  if (this != agent) {
    uVar1 = *(undefined8 *)(this->position_).val_;
    uVar2 = *(undefined8 *)(agent->position_).val_;
    local_28._0_4_ = (float)uVar1 - (float)uVar2;
    local_28._4_4_ = (float)((ulong)uVar1 >> 0x20) - (float)((ulong)uVar2 >> 0x20);
    local_20 = (Agent *)CONCAT44(local_20._4_4_,
                                 (this->position_).val_[2] - (agent->position_).val_[2]);
    fVar7 = absSq((Vector3 *)local_28);
    if (fVar7 < *rangeSq) {
      ppVar4 = (this->agentNeighbors_).
               super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = (long)(this->agentNeighbors_).
                    super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4 >> 4;
      if (uVar3 < this->maxNeighbors_) {
        local_28._0_4_ = fVar7;
        local_20 = agent;
        std::
        vector<std::pair<float,RVO::Agent_const*>,std::allocator<std::pair<float,RVO::Agent_const*>>>
        ::emplace_back<std::pair<float,RVO::Agent_const*>>
                  ((vector<std::pair<float,RVO::Agent_const*>,std::allocator<std::pair<float,RVO::Agent_const*>>>
                    *)&this->agentNeighbors_,(pair<float,_const_RVO::Agent_*> *)local_28);
        ppVar4 = (this->agentNeighbors_).
                 super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar3 = (long)(this->agentNeighbors_).
                      super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4 >> 4;
      }
      uVar5 = 1;
      for (ppAVar6 = &ppVar4[uVar3 - 1].second;
          (uVar3 != uVar5 && (fVar7 < *(float *)(ppAVar6 + -3))); ppAVar6 = ppAVar6 + -2) {
        ((pair<float,_const_RVO::Agent_*> *)(ppAVar6 + -1))->first = *(float *)(ppAVar6 + -3);
        *ppAVar6 = ppAVar6[-2];
        uVar5 = uVar5 + 1;
      }
      ((pair<float,_const_RVO::Agent_*> *)(ppAVar6 + -1))->first = fVar7;
      *ppAVar6 = agent;
      if (uVar3 == this->maxNeighbors_) {
        *rangeSq = (this->agentNeighbors_).
                   super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].first;
      }
    }
  }
  return;
}

Assistant:

void Agent::insertAgentNeighbor(const Agent *agent, float &rangeSq)
	{
		if (this != agent) {
			const float distSq = absSq(position_ - agent->position_);

			if (distSq < rangeSq) {
				if (agentNeighbors_.size() < maxNeighbors_) {
					agentNeighbors_.push_back(std::make_pair(distSq, agent));
				}

				size_t i = agentNeighbors_.size() - 1;

				while (i != 0 && distSq < agentNeighbors_[i - 1].first) {
					agentNeighbors_[i] = agentNeighbors_[i - 1];
					--i;
				}

				agentNeighbors_[i] = std::make_pair(distSq, agent);

				if (agentNeighbors_.size() == maxNeighbors_) {
					rangeSq = agentNeighbors_.back().first;
				}
			}
		}
	}